

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module_instrumentation.cpp
# Opt level: O2

void dxil_spv::emit_instrumentation_hash
               (SPIRVModule *module,InstructionInstrumentationState *instrumentation,Function *func,
               Id value_id,Id instruction_id)

{
  Id id;
  Id id_00;
  uint64_t uVar1;
  Id IVar2;
  Id IVar3;
  Builder *this;
  Block *this_00;
  Block *this_01;
  Instruction *pIVar4;
  Instruction *pIVar5;
  Instruction *pIVar6;
  Instruction *pIVar7;
  Instruction *pIVar8;
  Instruction *pIVar9;
  Instruction *pIVar10;
  Instruction *this_02;
  Instruction *this_03;
  Instruction *this_04;
  Instruction *this_05;
  uint u;
  Id IVar11;
  uint u_00;
  Id local_a4;
  Instruction *local_70;
  
  this = SPIRVModule::get_builder(module);
  this_00 = (Block *)allocate_in_thread(0x78);
  IVar11 = this->uniqueId + 1;
  this->uniqueId = IVar11;
  spv::Block::Block(this_00,IVar11,func);
  this_01 = (Block *)allocate_in_thread(0x78);
  IVar11 = this->uniqueId + 1;
  this->uniqueId = IVar11;
  spv::Block::Block(this_01,IVar11,func);
  IVar11 = spv::Builder::makeUintType(this,0x20);
  IVar2 = spv::Builder::makeBoolType(this);
  pIVar4 = spv::Builder::addInstruction(this,IVar11,OpIMul);
  local_70 = spv::Builder::addInstruction(this,IVar11,OpBitwiseXor);
  spv::Instruction::addIdOperand(pIVar4,instruction_id);
  IVar3 = spv::Builder::makeUintConstant(this,0x61,false);
  spv::Instruction::addIdOperand(pIVar4,IVar3);
  spv::Instruction::addIdOperand(local_70,pIVar4->resultId);
  uVar1 = (instrumentation->info).shader_hash;
  u = (uint)uVar1;
  u_00 = (uint)(uVar1 >> 0x20);
  IVar3 = spv::Builder::makeUintConstant(this,u_00 ^ u,false);
  spv::Instruction::addIdOperand(local_70,IVar3);
  local_a4 = value_id;
  if (value_id == 0) {
    pIVar4 = spv::Builder::addInstruction(this,IVar11,OpArrayLength);
    spv::Instruction::addIdOperand(pIVar4,instrumentation->global_nan_inf_control_var_id);
    spv::Instruction::addImmediateOperand(pIVar4,0);
    pIVar5 = spv::Builder::addInstruction(this,IVar11,OpISub);
    spv::Instruction::addIdOperand(pIVar5,pIVar4->resultId);
    IVar3 = spv::Builder::makeUintConstant(this,2,false);
    spv::Instruction::addIdOperand(pIVar5,IVar3);
    IVar3 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar11);
    pIVar4 = spv::Builder::addInstruction(this,IVar3,OpAccessChain);
    spv::Instruction::addIdOperand(pIVar4,instrumentation->global_nan_inf_control_var_id);
    IVar3 = spv::Builder::makeUintConstant(this,0,false);
    spv::Instruction::addIdOperand(pIVar4,IVar3);
    spv::Instruction::addIdOperand(pIVar4,pIVar5->resultId);
    pIVar5 = spv::Builder::addInstruction(this,IVar11,OpLoad);
    spv::Instruction::addIdOperand(pIVar5,pIVar4->resultId);
    local_a4 = pIVar5->resultId;
    pIVar4 = spv::Builder::addInstruction(this,IVar11,OpIMul);
    spv::Instruction::addIdOperand(pIVar4,local_a4);
    IVar3 = spv::Builder::makeUintConstant(this,0xc881,false);
    spv::Instruction::addIdOperand(pIVar4,IVar3);
    pIVar5 = spv::Builder::addInstruction(this,IVar11,OpBitwiseXor);
    spv::Instruction::addIdOperand(pIVar5,local_70->resultId);
    spv::Instruction::addIdOperand(pIVar5,pIVar4->resultId);
    local_70 = pIVar5;
  }
  pIVar4 = spv::Builder::addInstruction(this,IVar11,OpArrayLength);
  pIVar5 = spv::Builder::addInstruction(this,IVar11,OpISub);
  pIVar6 = spv::Builder::addInstruction(this,IVar11,OpBitwiseAnd);
  pIVar7 = spv::Builder::addInstruction(this,IVar11,OpShiftRightLogical);
  pIVar8 = spv::Builder::addInstruction(this,IVar11,OpBitwiseAnd);
  pIVar9 = spv::Builder::addInstruction(this,IVar11,OpShiftLeftLogical);
  IVar3 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar11);
  pIVar10 = spv::Builder::addInstruction(this,IVar3,OpAccessChain);
  this_02 = spv::Builder::addInstruction(this,IVar11,OpAtomicOr);
  this_03 = spv::Builder::addInstruction(this,IVar11,OpBitwiseAnd);
  this_04 = spv::Builder::addInstruction(this,IVar2,OpIEqual);
  this_05 = spv::Builder::addInstruction(this,OpStore);
  spv::Instruction::addIdOperand(pIVar4,instrumentation->global_nan_inf_data_var_id);
  spv::Instruction::addImmediateOperand(pIVar4,0);
  spv::Instruction::addIdOperand(pIVar5,pIVar4->resultId);
  IVar2 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(pIVar5,IVar2);
  spv::Instruction::addIdOperand(pIVar6,local_70->resultId);
  spv::Instruction::addIdOperand(pIVar6,pIVar5->resultId);
  IVar2 = pIVar6->resultId;
  spv::Instruction::addIdOperand(pIVar7,IVar2);
  IVar3 = spv::Builder::makeUintConstant(this,4,false);
  spv::Instruction::addIdOperand(pIVar7,IVar3);
  spv::Instruction::addIdOperand(pIVar8,pIVar6->resultId);
  IVar3 = spv::Builder::makeUintConstant(this,0xf,false);
  spv::Instruction::addIdOperand(pIVar8,IVar3);
  IVar3 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(pIVar9,IVar3);
  spv::Instruction::addIdOperand(pIVar9,pIVar8->resultId);
  spv::Instruction::addIdOperand(pIVar10,instrumentation->global_nan_inf_control_var_id);
  IVar3 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(pIVar10,IVar3);
  spv::Instruction::addIdOperand(pIVar10,pIVar7->resultId);
  spv::Instruction::addIdOperand(this_02,pIVar10->resultId);
  IVar3 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(this_02,IVar3);
  IVar3 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(this_02,IVar3);
  spv::Instruction::addIdOperand(this_02,pIVar9->resultId);
  spv::Instruction::addIdOperand(this_03,this_02->resultId);
  spv::Instruction::addIdOperand(this_03,pIVar9->resultId);
  spv::Instruction::addIdOperand(this_04,this_03->resultId);
  IVar3 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(this_04,IVar3);
  spv::Instruction::addIdOperand(this_05,instrumentation->should_report_instrumentation_id);
  IVar3 = spv::Builder::makeBoolConstant(this,false,false);
  spv::Instruction::addIdOperand(this_05,IVar3);
  IVar3 = this_04->resultId;
  id = pIVar9->resultId;
  id_00 = pIVar10->resultId;
  spv::Builder::createSelectionMerge(this,this_01,0);
  spv::Builder::createConditionalBranch(this,IVar3,this_00,this_01);
  this->buildPoint = this_00;
  IVar3 = spv::Builder::makeVectorType(this,IVar11,4);
  pIVar4 = spv::Builder::addInstruction(this,IVar3,OpCompositeConstruct);
  pIVar5 = spv::Builder::addInstruction(this,IVar11,OpShiftLeftLogical);
  IVar3 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar3);
  pIVar6 = spv::Builder::addInstruction(this,IVar3,OpAccessChain);
  pIVar7 = spv::Builder::addInstruction(this,OpStore);
  pIVar8 = spv::Builder::addInstruction(this,OpMemoryBarrier);
  pIVar9 = spv::Builder::addInstruction(this,IVar11,OpAtomicOr);
  pIVar10 = spv::Builder::addInstruction(this,OpMemoryBarrier);
  IVar11 = spv::Builder::makeUintConstant(this,u,false);
  spv::Instruction::addIdOperand(pIVar4,IVar11);
  IVar11 = spv::Builder::makeUintConstant(this,u_00,false);
  spv::Instruction::addIdOperand(pIVar4,IVar11);
  spv::Instruction::addIdOperand
            (pIVar4,(func->parameterInstructions).
                    super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[1]->resultId);
  spv::Instruction::addIdOperand(pIVar4,local_a4);
  spv::Instruction::addIdOperand(pIVar5,id);
  IVar11 = spv::Builder::makeUintConstant(this,0x10,false);
  spv::Instruction::addIdOperand(pIVar5,IVar11);
  spv::Instruction::addIdOperand(pIVar6,instrumentation->global_nan_inf_data_var_id);
  IVar11 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(pIVar6,IVar11);
  spv::Instruction::addIdOperand(pIVar6,IVar2);
  spv::Instruction::addIdOperand(pIVar7,pIVar6->resultId);
  spv::Instruction::addIdOperand(pIVar7,pIVar4->resultId);
  IVar11 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(pIVar8,IVar11);
  IVar11 = spv::Builder::makeUintConstant(this,0x48,false);
  spv::Instruction::addIdOperand(pIVar8,IVar11);
  IVar11 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(pIVar10,IVar11);
  IVar11 = spv::Builder::makeUintConstant(this,0x48,false);
  spv::Instruction::addIdOperand(pIVar10,IVar11);
  spv::Instruction::addIdOperand(pIVar9,id_00);
  IVar11 = spv::Builder::makeUintConstant(this,1,false);
  spv::Instruction::addIdOperand(pIVar9,IVar11);
  IVar11 = spv::Builder::makeUintConstant(this,0,false);
  spv::Instruction::addIdOperand(pIVar9,IVar11);
  spv::Instruction::addIdOperand(pIVar9,pIVar5->resultId);
  spv::Builder::createBranch(this,this_01);
  this->buildPoint = this_01;
  return;
}

Assistant:

void emit_instrumentation_hash(SPIRVModule &module, const InstructionInstrumentationState &instrumentation,
                               spv::Function *func, spv::Id value_id, spv::Id instruction_id)
{
	auto &builder = module.get_builder();
	auto *write_payload_path = new spv::Block(builder.getUniqueId(), *func);
	auto *merge_payload_path = new spv::Block(builder.getUniqueId(), *func);

	spv::Id u32_type = builder.makeUintType(32);
	spv::Id bool_type = builder.makeBoolType();
	auto *prime_mul = builder.addInstruction(u32_type, spv::OpIMul);
	auto *hash = builder.addInstruction(u32_type, spv::OpBitwiseXor);

	prime_mul->addIdOperand(instruction_id);
	prime_mul->addIdOperand(builder.makeUintConstant(97)); // Arbitrary prime number

	hash->addIdOperand(prime_mul->getResultId());
	auto shader_hash = instrumentation.info.shader_hash;
	hash->addIdOperand(builder.makeUintConstant(uint32_t(shader_hash) ^ uint32_t(shader_hash >> 32)));

	if (!value_id)
	{
		// For AssumeTrue instrumentation, we're more interested in the dispatch ID.
		// We've reserved space for it in the second last u32 of the control buffer.
		auto *len = builder.addInstruction(u32_type, spv::OpArrayLength);
		len->addIdOperand(instrumentation.global_nan_inf_control_var_id);
		len->addImmediateOperand(0);

		auto *len_minus_2 = builder.addInstruction(u32_type, spv::OpISub);
		len_minus_2->addIdOperand(len->getResultId());
		len_minus_2->addIdOperand(builder.makeUintConstant(2));

		auto *cookie_chain = builder.addInstruction(
		    builder.makePointer(spv::StorageClassStorageBuffer, u32_type), spv::OpAccessChain);
		cookie_chain->addIdOperand(instrumentation.global_nan_inf_control_var_id);
		cookie_chain->addIdOperand(builder.makeUintConstant(0));
		cookie_chain->addIdOperand(len_minus_2->getResultId());

		auto *load = builder.addInstruction(u32_type, spv::OpLoad);
		load->addIdOperand(cookie_chain->getResultId());
		value_id = load->getResultId();

		auto *mul = builder.addInstruction(u32_type, spv::OpIMul);
		mul->addIdOperand(value_id);
		mul->addIdOperand(builder.makeUintConstant(51329u));

		// Allow each dispatch to report their own faults.
		auto *ext_hash = builder.addInstruction(u32_type, spv::OpBitwiseXor);
		ext_hash->addIdOperand(hash->getResultId());
		ext_hash->addIdOperand(mul->getResultId());

		hash = ext_hash;
	}

	auto *payload_size = builder.addInstruction(u32_type, spv::OpArrayLength);
	auto *sub_1 = builder.addInstruction(u32_type, spv::OpISub);
	auto *mask = builder.addInstruction(u32_type, spv::OpBitwiseAnd);
	auto *control_word = builder.addInstruction(u32_type, spv::OpShiftRightLogical);
	auto *control_bit = builder.addInstruction(u32_type, spv::OpBitwiseAnd);
	auto *control_mask = builder.addInstruction(u32_type, spv::OpShiftLeftLogical);
	auto *access_chain = builder.addInstruction(
	    builder.makePointer(spv::StorageClassStorageBuffer, u32_type),
	    spv::OpAccessChain);
	auto *atomic_or = builder.addInstruction(u32_type, spv::OpAtomicOr);
	auto *atomic_result_mask = builder.addInstruction(u32_type, spv::OpBitwiseAnd);
	auto *atomic_need_write = builder.addInstruction(bool_type, spv::OpIEqual);
	auto *store_op = builder.addInstruction(spv::OpStore);

	payload_size->addIdOperand(instrumentation.global_nan_inf_data_var_id);
	payload_size->addImmediateOperand(0);
	sub_1->addIdOperand(payload_size->getResultId());
	sub_1->addIdOperand(builder.makeUintConstant(1));
	mask->addIdOperand(hash->getResultId());
	mask->addIdOperand(sub_1->getResultId());
	spv::Id mask_id = mask->getResultId();

	control_word->addIdOperand(mask->getResultId());
	control_word->addIdOperand(builder.makeUintConstant(4));
	control_bit->addIdOperand(mask->getResultId());
	control_bit->addIdOperand(builder.makeUintConstant(15));
	control_mask->addIdOperand(builder.makeUintConstant(1));
	control_mask->addIdOperand(control_bit->getResultId());

	access_chain->addIdOperand(instrumentation.global_nan_inf_control_var_id);
	access_chain->addIdOperand(builder.makeUintConstant(0));
	access_chain->addIdOperand(control_word->getResultId());

	atomic_or->addIdOperand(access_chain->getResultId());
	atomic_or->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
	atomic_or->addIdOperand(builder.makeUintConstant(0));
	atomic_or->addIdOperand(control_mask->getResultId());

	atomic_result_mask->addIdOperand(atomic_or->getResultId());
	atomic_result_mask->addIdOperand(control_mask->getResultId());
	atomic_need_write->addIdOperand(atomic_result_mask->getResultId());
	atomic_need_write->addIdOperand(builder.makeUintConstant(0));

	store_op->addIdOperand(instrumentation.should_report_instrumentation_id);
	store_op->addIdOperand(builder.makeBoolConstant(false));

	spv::Id cond_id = atomic_need_write->getResultId();
	spv::Id control_mask_id = control_mask->getResultId();
	spv::Id control_chain_id = access_chain->getResultId();

	builder.createSelectionMerge(merge_payload_path, 0);
	builder.createConditionalBranch(cond_id, write_payload_path, merge_payload_path);
	builder.setBuildPoint(write_payload_path);
	{
		spv::Id uvec4_type = builder.makeVectorType(u32_type, 4);

		auto *composite = builder.addInstruction(uvec4_type, spv::OpCompositeConstruct);
		auto *shift_16 = builder.addInstruction(u32_type, spv::OpShiftLeftLogical);
		access_chain = builder.addInstruction(
			builder.makePointer(spv::StorageClassStorageBuffer, uvec4_type),
			spv::OpAccessChain);
		store_op = builder.addInstruction(spv::OpStore);
		auto *barrier_op = builder.addInstruction(spv::OpMemoryBarrier);
		atomic_or = builder.addInstruction(u32_type, spv::OpAtomicOr);
		// Important this comes after the atomic or.
		auto *barrier_op2 = builder.addInstruction(spv::OpMemoryBarrier);

		composite->addIdOperand(builder.makeUintConstant(uint32_t(shader_hash >> 0)));
		composite->addIdOperand(builder.makeUintConstant(uint32_t(shader_hash >> 32)));
		composite->addIdOperand(func->getParamId(1));
		composite->addIdOperand(value_id);

		shift_16->addIdOperand(control_mask_id);
		shift_16->addIdOperand(builder.makeUintConstant(16));

		access_chain->addIdOperand(instrumentation.global_nan_inf_data_var_id);
		access_chain->addIdOperand(builder.makeUintConstant(0));
		access_chain->addIdOperand(mask_id);

		store_op->addIdOperand(access_chain->getResultId());
		store_op->addIdOperand(composite->getResultId());

		barrier_op->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		barrier_op->addIdOperand(builder.makeUintConstant(spv::MemorySemanticsUniformMemoryMask |
		                                                  spv::MemorySemanticsAcquireReleaseMask));
		barrier_op2->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		barrier_op2->addIdOperand(builder.makeUintConstant(spv::MemorySemanticsUniformMemoryMask |
		                                                   spv::MemorySemanticsAcquireReleaseMask));

		atomic_or->addIdOperand(control_chain_id);
		atomic_or->addIdOperand(builder.makeUintConstant(spv::ScopeDevice));
		atomic_or->addIdOperand(builder.makeUintConstant(0));
		atomic_or->addIdOperand(shift_16->getResultId());

		builder.createBranch(merge_payload_path);
	}
	builder.setBuildPoint(merge_payload_path);
}